

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

void __thiscall plot::Border::Border(Border *this,BorderStyle style,bool rounded_corners)

{
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  byte local_15;
  BorderStyle local_14;
  bool rounded_corners_local;
  Border *pBStack_10;
  BorderStyle style_local;
  Border *this_local;
  
  local_15 = rounded_corners;
  local_14 = style;
  pBStack_10 = this;
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->top_left);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->top);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->top_right);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->left);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->right);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->bottom_left);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->bottom);
  std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
  basic_string_view(&this->bottom_right);
  switch(local_14) {
  case None:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_28," ");
    (this->bottom_right)._M_len = local_28._M_len;
    (this->bottom_right)._M_str = local_28._M_str;
    (this->bottom)._M_len = (this->bottom_right)._M_len;
    (this->bottom)._M_str = (this->bottom_right)._M_str;
    (this->bottom_left)._M_len = (this->bottom)._M_len;
    (this->bottom_left)._M_str = (this->bottom)._M_str;
    (this->right)._M_len = (this->bottom_left)._M_len;
    (this->right)._M_str = (this->bottom_left)._M_str;
    (this->left)._M_len = (this->right)._M_len;
    (this->left)._M_str = (this->right)._M_str;
    (this->top_right)._M_len = (this->left)._M_len;
    (this->top_right)._M_str = (this->left)._M_str;
    (this->top)._M_len = (this->top_right)._M_len;
    (this->top)._M_str = (this->top_right)._M_str;
    (this->top_left)._M_len = (this->top)._M_len;
    (this->top_left)._M_str = (this->top)._M_str;
    return;
  case Solid:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_38,anon_var_dwarf_73b1);
    (this->bottom)._M_len = local_38._M_len;
    (this->bottom)._M_str = local_38._M_str;
    (this->top)._M_len = (this->bottom)._M_len;
    (this->top)._M_str = (this->bottom)._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_48,anon_var_dwarf_73bd);
    (this->right)._M_len = local_48._M_len;
    (this->right)._M_str = local_48._M_str;
    (this->left)._M_len = (this->right)._M_len;
    (this->left)._M_str = (this->right)._M_str;
    break;
  case SolidBold:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_58,anon_var_dwarf_73c9);
    (this->bottom)._M_len = local_58._M_len;
    (this->bottom)._M_str = local_58._M_str;
    (this->top)._M_len = (this->bottom)._M_len;
    (this->top)._M_str = (this->bottom)._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_68,anon_var_dwarf_73d5);
    (this->right)._M_len = local_68._M_len;
    (this->right)._M_str = local_68._M_str;
    (this->left)._M_len = (this->right)._M_len;
    (this->left)._M_str = (this->right)._M_str;
    break;
  case Dashed:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_78,anon_var_dwarf_73e1);
    (this->top)._M_len = local_78._M_len;
    (this->top)._M_str = local_78._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_88,anon_var_dwarf_73ed);
    (this->bottom)._M_len = local_88._M_len;
    (this->bottom)._M_str = local_88._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_98,anon_var_dwarf_73f9);
    (this->left)._M_len = local_98._M_len;
    (this->left)._M_str = local_98._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_a8,anon_var_dwarf_7405);
    (this->right)._M_len = local_a8._M_len;
    (this->right)._M_str = local_a8._M_str;
    break;
  case DashedBold:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_b8,anon_var_dwarf_7411);
    (this->top)._M_len = local_b8._M_len;
    (this->top)._M_str = local_b8._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_c8,anon_var_dwarf_741d);
    (this->bottom)._M_len = local_c8._M_len;
    (this->bottom)._M_str = local_c8._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_d8,anon_var_dwarf_7429);
    (this->left)._M_len = local_d8._M_len;
    (this->left)._M_str = local_d8._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_e8,anon_var_dwarf_7435);
    (this->right)._M_len = local_e8._M_len;
    (this->right)._M_str = local_e8._M_str;
    break;
  case Dotted:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_f8,anon_var_dwarf_7441);
    (this->bottom)._M_len = local_f8._M_len;
    (this->bottom)._M_str = local_f8._M_str;
    (this->top)._M_len = (this->bottom)._M_len;
    (this->top)._M_str = (this->bottom)._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_108,anon_var_dwarf_744d);
    (this->right)._M_len = local_108._M_len;
    (this->right)._M_str = local_108._M_str;
    (this->left)._M_len = (this->right)._M_len;
    (this->left)._M_str = (this->right)._M_str;
    break;
  case DottedBold:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_118,anon_var_dwarf_7459);
    (this->bottom)._M_len = local_118._M_len;
    (this->bottom)._M_str = local_118._M_str;
    (this->top)._M_len = (this->bottom)._M_len;
    (this->top)._M_str = (this->bottom)._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_128,anon_var_dwarf_7465);
    (this->right)._M_len = local_128._M_len;
    (this->right)._M_str = local_128._M_str;
    (this->left)._M_len = (this->right)._M_len;
    (this->left)._M_str = (this->right)._M_str;
    break;
  case Double:
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_138,anon_var_dwarf_7471);
    (this->bottom)._M_len = local_138._M_len;
    (this->bottom)._M_str = local_138._M_str;
    (this->top)._M_len = (this->bottom)._M_len;
    (this->top)._M_str = (this->bottom)._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_148,anon_var_dwarf_747d);
    (this->right)._M_len = local_148._M_len;
    (this->right)._M_str = local_148._M_str;
    (this->left)._M_len = (this->right)._M_len;
    (this->left)._M_str = (this->right)._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_158,anon_var_dwarf_7489);
    (this->top_left)._M_len = local_158._M_len;
    (this->top_left)._M_str = local_158._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_168,anon_var_dwarf_7495);
    (this->top_right)._M_len = local_168._M_len;
    (this->top_right)._M_str = local_168._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_178,anon_var_dwarf_74a1);
    (this->bottom_left)._M_len = local_178._M_len;
    (this->bottom_left)._M_str = local_178._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_188,anon_var_dwarf_74ad);
    (this->bottom_right)._M_len = local_188._M_len;
    (this->bottom_right)._M_str = local_188._M_str;
    return;
  }
  if (local_14 == Solid) {
LAB_0012045b:
    if ((local_15 & 1) == 0) {
      local_228 = anon_var_dwarf_74c5;
    }
    else {
      local_228 = anon_var_dwarf_74b9;
    }
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_198,local_228);
    (this->top_left)._M_len = local_198._M_len;
    (this->top_left)._M_str = local_198._M_str;
    if ((local_15 & 1) == 0) {
      local_230 = anon_var_dwarf_74dd;
    }
    else {
      local_230 = anon_var_dwarf_74d1;
    }
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_1a8,local_230);
    (this->top_right)._M_len = local_1a8._M_len;
    (this->top_right)._M_str = local_1a8._M_str;
    if ((local_15 & 1) == 0) {
      local_238 = anon_var_dwarf_74f5;
    }
    else {
      local_238 = anon_var_dwarf_74e9;
    }
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_1b8,local_238);
    (this->bottom_left)._M_len = local_1b8._M_len;
    (this->bottom_left)._M_str = local_1b8._M_str;
    if ((local_15 & 1) == 0) {
      local_240 = anon_var_dwarf_750d;
    }
    else {
      local_240 = anon_var_dwarf_7501;
    }
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_1c8,local_240);
    (this->bottom_right)._M_len = local_1c8._M_len;
    (this->bottom_right)._M_str = local_1c8._M_str;
  }
  else {
    if (local_14 != SolidBold) {
      if (local_14 == Dashed) goto LAB_0012045b;
      if (local_14 != DashedBold) {
        if (local_14 == Dotted) goto LAB_0012045b;
        if (local_14 != DottedBold) {
          return;
        }
      }
    }
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_1d8,anon_var_dwarf_7519);
    (this->top_left)._M_len = local_1d8._M_len;
    (this->top_left)._M_str = local_1d8._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_1e8,anon_var_dwarf_7525);
    (this->top_right)._M_len = local_1e8._M_len;
    (this->top_right)._M_str = local_1e8._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_1f8,anon_var_dwarf_7531);
    (this->bottom_left)._M_len = local_1f8._M_len;
    (this->bottom_left)._M_str = local_1f8._M_str;
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view(&local_208,anon_var_dwarf_753d);
    (this->bottom_right)._M_len = local_208._M_len;
    (this->bottom_right)._M_str = local_208._M_str;
  }
  return;
}

Assistant:

Border(BorderStyle style = BorderStyle::None, bool rounded_corners = false) {
        switch (style) {
            case BorderStyle::None:
                top_left = top = top_right = left = right =
                    bottom_left = bottom = bottom_right = u8" ";
                return;
            case BorderStyle::Solid:
                top = bottom = u8"─";
                left = right = u8"│";
                break;
            case BorderStyle::SolidBold:
                top = bottom = u8"━";
                left = right = u8"┃";
                break;
            case BorderStyle::Dashed:
                top = u8"╴"; bottom = u8"╶";
                left = u8"╷"; right = u8"╵";
                break;
            case BorderStyle::DashedBold:
                top = u8"╸"; bottom = u8"╺";
                left = u8"╻"; right = u8"╹";
                break;
            case BorderStyle::Dotted:
                top = bottom = u8"┈";
                left = right = u8"┊";
                break;
            case BorderStyle::DottedBold:
                top = bottom = u8"┉";
                left = right = u8"┋";
                break;
            case BorderStyle::Double:
                top = bottom = u8"═";
                left = right = u8"║";
                top_left = u8"╔"; top_right = u8"╗";
                bottom_left = u8"╚"; bottom_right = u8"╝";
                return;
        }

        switch (style) {
            case BorderStyle::Solid:
            case BorderStyle::Dashed:
            case BorderStyle::Dotted:
                top_left = (rounded_corners) ? u8"╭" : u8"┌";
                top_right = (rounded_corners) ? u8"╮" : u8"┐";
                bottom_left = (rounded_corners) ? u8"╰" : u8"└";
                bottom_right = (rounded_corners) ? u8"╯" : u8"┘";
                return;
            case BorderStyle::SolidBold:
            case BorderStyle::DashedBold:
            case BorderStyle::DottedBold:
                top_left = u8"┏"; top_right = u8"┓";
                bottom_left = u8"┗"; bottom_right = u8"┛";
                return;
            default:
                return;
        }
    }